

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

OrderedArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedArgumentSyntax,slang::syntax::OrderedArgumentSyntax_const&>
          (BumpAllocator *this,OrderedArgumentSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  PropertyExprSyntax *pPVar3;
  undefined4 uVar4;
  OrderedArgumentSyntax *pOVar5;
  
  pOVar5 = (OrderedArgumentSyntax *)allocate(this,0x20,8);
  uVar4 = *(undefined4 *)&(args->super_ArgumentSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ArgumentSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ArgumentSyntax).super_SyntaxNode.previewNode;
  pPVar3 = (args->expr).ptr;
  (pOVar5->super_ArgumentSyntax).super_SyntaxNode.kind =
       (args->super_ArgumentSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pOVar5->super_ArgumentSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pOVar5->super_ArgumentSyntax).super_SyntaxNode.parent = pSVar1;
  (pOVar5->super_ArgumentSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pOVar5->expr).ptr = pPVar3;
  return pOVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }